

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_option_message.hpp
# Opt level: O2

void iutest::detail::iuOptionMessage::ShowHelp(void)

{
  iuConsole::color_output
            (cyan,
             "--------------------------------------------------\nName\n    iutest - iris unit test framework\n--------------------------------------------------\nCommand Line Options\n\n    --help, -h                       : Generate help message.\n    --iutest_list_tests              : List up tests.\n    --iutest_list_tests_with_where   : List up tests with where.\n    --iutest_color=<yes|no|auto|ansi>: Console color enable.\n    --iutest_flagfile=<file>         : Set the flag from the file.\n    --iutest_filter=<filter>         : Select the test run.\n    --iutest_shuffle                 : Do shuffle test.\n    --iutest_random_seed=<seed>      : Set random seed.\n    --iutest_also_run_disabled_tests : Run disabled tests.\n    --iutest_break_on_failure[=0|1]  : When that failed to break.\n    --iutest_throw_on_failure[=0|1]  : When that failed to throw.\n    --iutest_catch_exceptions=<0|1>  : Catch exceptions enable.\n    --iutest_print_time=<0|1>        : Setting the display of elapsed time.\n    --iutest_default_package_name=<name>\n            : Set default root package name.\n    --iutest_output=<xml|junit>[:path]\n            : Path of xml report.\n    --iutest_repeat=<count>\n            : Set the number of repetitions of the test.\n              use a negative count to repeat forever.\n    --iutest_stream_result_to=<host:port>\n                                     : Set stream test results server.\n    --iutest_file_location=<auto|vs|gcc>\n                                     : Format file location messages.\n    --verbose                        : Verbose option.\n    --feature                        : Show iutest feature.\n    --version, -v                    : Show iutest version.\n\n--------------------------------------------------\nLicense\n\n    Copyright (c) 2011-2018, Takazumi-Shirayanagi\n\n    This software is released under the new BSD License, see LICENSE\n\n"
            );
  return;
}

Assistant:

inline void iuOptionMessage::ShowHelp()
{
    detail::iuConsole::color_output(detail::iuConsole::cyan,
        "--------------------------------------------------\n"
        "Name\n"
        "    iutest - iris unit test framework\n"
        "--------------------------------------------------\n"
        "Command Line Options\n"
        "\n"
        "    --help, -h                       : Generate help message.\n"
        "    --iutest_list_tests              : List up tests.\n"
        "    --iutest_list_tests_with_where   : List up tests with where.\n"
        "    --iutest_color=<yes|no|auto|ansi>: Console color enable.\n"
        "    --iutest_flagfile=<file>         : Set the flag from the file.\n"
        "    --iutest_filter=<filter>         : Select the test run.\n"
        "    --iutest_shuffle                 : Do shuffle test.\n"
        "    --iutest_random_seed=<seed>      : Set random seed.\n"
        "    --iutest_also_run_disabled_tests : Run disabled tests.\n"
        "    --iutest_break_on_failure[=0|1]  : When that failed to break.\n"
        "    --iutest_throw_on_failure[=0|1]  : When that failed to throw.\n"
        "    --iutest_catch_exceptions=<0|1>  : Catch exceptions enable.\n"
        "    --iutest_print_time=<0|1>        : Setting the display of elapsed time.\n"
        "    --iutest_default_package_name=<name>\n"
        "            : Set default root package name.\n"
        "    --iutest_output=<xml|junit>[:path]\n"
        "            : Path of xml report.\n"
        "    --iutest_repeat=<count>\n"
        "            : Set the number of repetitions of the test.\n"
        "              use a negative count to repeat forever.\n"
#if IUTEST_HAS_STREAM_RESULT
        "    --iutest_stream_result_to=<host:port>\n"
        "                                     : Set stream test results server.\n"
#endif
        "    --iutest_file_location=<auto|vs|gcc>\n"
        "                                     : Format file location messages.\n"
        "    --verbose                        : Verbose option.\n"
        "    --feature                        : Show iutest feature.\n"
        "    --version, -v                    : Show iutest version.\n"
        "\n"
        "--------------------------------------------------\n"
        "License\n"
        "\n"
        "    Copyright (c) 2011-2018, Takazumi-Shirayanagi\n"
        "\n"
        "    This software is released under the new BSD License, see LICENSE\n"
        "\n"
    );
}